

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkylineBinPack.cpp
# Opt level: O1

void __thiscall
SkylineBinPack::Insert
          (SkylineBinPack *this,TArray<RectSize,_RectSize> *rects,TArray<Rect,_Rect> *dst)

{
  DisjointRectCollection *this_00;
  Rect *pRVar1;
  long lVar2;
  SkylineBinPack *pSVar3;
  Rect RVar4;
  TArray<Rect,_Rect> *this_01;
  bool bVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  int score2;
  int index;
  int score1;
  Rect bestNode;
  int local_78;
  int local_74;
  SkylineBinPack *local_70;
  int local_68;
  int local_64;
  Rect local_60;
  TArray<Rect,_Rect> *local_50;
  Rect local_48;
  
  if (dst->Count != 0) {
    dst->Count = 0;
  }
  if (*(int *)(rects + 0xc) != 0) {
    this_00 = &this->disjointRects;
    local_70 = this;
    local_50 = dst;
    while( true ) {
      if (*(int *)(rects + 0xc) == 0) {
        local_78 = -1;
        uVar11 = 0xffffffff;
      }
      else {
        uVar11 = 0xffffffff;
        iVar9 = 0x7fffffff;
        uVar7 = 0;
        iVar8 = 0x7fffffff;
        local_78 = -1;
        do {
          local_60 = FindPositionForNewNodeMinWaste
                               (local_70,*(int *)(*(long *)rects + uVar7 * 8),
                                *(int *)(*(long *)rects + 4 + uVar7 * 8),&local_74,&local_64,
                                &local_68);
          bVar5 = DisjointRectCollection::Disjoint(this_00,&local_60);
          RVar4 = local_60;
          if (!bVar5) {
            __assert_fail("disjointRects.Disjoint(newNode)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/SkylineBinPack.cpp"
                          ,0x49,"void SkylineBinPack::Insert(TArray<RectSize> &, TArray<Rect> &)");
          }
          if ((local_60.height != 0) &&
             ((local_64 < iVar9 || ((local_64 == iVar9 && (local_74 < iVar8)))))) {
            local_48.x = local_60.x;
            local_48.y = local_60.y;
            local_48.width = local_60.width;
            local_48.height = local_60.height;
            local_78 = local_68;
            uVar11 = uVar7 & 0xffffffff;
            iVar9 = local_64;
            iVar8 = local_74;
          }
          uVar7 = uVar7 + 1;
          local_60 = RVar4;
        } while (uVar7 < *(uint *)(rects + 0xc));
      }
      uVar10 = (uint)uVar11;
      if (uVar10 == 0xffffffff) break;
      bVar5 = DisjointRectCollection::Disjoint(this_00,&local_48);
      if (!bVar5) {
        __assert_fail("disjointRects.Disjoint(bestNode)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/SkylineBinPack.cpp"
                      ,0x5d,"void SkylineBinPack::Insert(TArray<RectSize> &, TArray<Rect> &)");
      }
      DisjointRectCollection::Add(this_00,&local_48);
      pSVar3 = local_70;
      AddSkylineLevel(local_70,local_78,&local_48);
      this_01 = local_50;
      lVar2 = *(long *)rects;
      pSVar3->usedSurfaceArea =
           pSVar3->usedSurfaceArea +
           (long)*(int *)(lVar2 + 4 + (long)(int)uVar10 * 8) *
           (long)*(int *)(lVar2 + (long)(int)uVar10 * 8);
      if (uVar10 < *(uint *)(rects + 0xc)) {
        uVar6 = *(uint *)(rects + 0xc) - 1;
        *(uint *)(rects + 0xc) = uVar6;
        if (uVar10 <= uVar6 && uVar6 - uVar10 != 0) {
          memmove((void *)(lVar2 + uVar11 * 8),(void *)(lVar2 + (ulong)(uVar10 + 1) * 8),
                  (ulong)(uVar6 - uVar10) << 3);
        }
      }
      TArray<Rect,_Rect>::Grow(this_01,1);
      pRVar1 = this_01->Array + this_01->Count;
      pRVar1->x = local_48.x;
      pRVar1->y = local_48.y;
      pRVar1->width = local_48.width;
      pRVar1->height = local_48.height;
      this_01->Count = this_01->Count + 1;
      if (uVar10 == 0xffffffff) {
        return;
      }
      if (*(int *)(rects + 0xc) == 0) {
        return;
      }
    }
  }
  return;
}

Assistant:

void SkylineBinPack::Insert(TArray<RectSize> &rects, TArray<Rect> &dst)
{
	dst.Clear();

	while(rects.Size() > 0)
	{
		Rect bestNode;
		int bestScore1 = INT_MAX;
		int bestScore2 = INT_MAX;
		int bestSkylineIndex = -1;
		int bestRectIndex = -1;
		for(unsigned i = 0; i < rects.Size(); ++i)
		{
			Rect newNode;
			int score1;
			int score2;
			int index;
			newNode = FindPositionForNewNodeMinWaste(rects[i].width, rects[i].height, score2, score1, index);
#ifdef _DEBUG
			assert(disjointRects.Disjoint(newNode));
#endif
			if (newNode.height != 0)
			{
				if (score1 < bestScore1 || (score1 == bestScore1 && score2 < bestScore2))
				{
					bestNode = newNode;
					bestScore1 = score1;
					bestScore2 = score2;
					bestSkylineIndex = index;
					bestRectIndex = i;
				}
			}
		}

		if (bestRectIndex == -1)
			return;

		// Perform the actual packing.
#ifdef _DEBUG
		assert(disjointRects.Disjoint(bestNode));
		disjointRects.Add(bestNode);
#endif
		AddSkylineLevel(bestSkylineIndex, bestNode);
		usedSurfaceArea += rects[bestRectIndex].width * rects[bestRectIndex].height;
		rects.Delete(bestRectIndex);
		dst.Push(bestNode);
	}
}